

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linear_algebra.c
# Opt level: O3

void la_ddot(int n,double *x,int incx,double *y,int incy,double *alpha)

{
  ulong uVar1;
  double dVar2;
  
  if (x == (double *)0x0) {
    __assert_fail("x",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/rosym-project[P]dyn2b/src/dyn2b/linear_algebra.c"
                  ,0x6f,"void la_ddot(int, double *, int, double *, int, double *)");
  }
  if (y != (double *)0x0) {
    *alpha = 0.0;
    if (0 < n) {
      uVar1 = (ulong)(uint)n;
      dVar2 = 0.0;
      do {
        dVar2 = dVar2 + *x * *y;
        *alpha = dVar2;
        y = y + incy;
        x = x + incx;
        uVar1 = uVar1 - 1;
      } while (uVar1 != 0);
    }
    return;
  }
  __assert_fail("y",
                "/workspace/llm4binary/github/license_all_cmakelists_25/rosym-project[P]dyn2b/src/dyn2b/linear_algebra.c"
                ,0x70,"void la_ddot(int, double *, int, double *, int, double *)");
}

Assistant:

void la_ddot(
        int n,
        double *x, int incx,
        double *y, int incy,
        double *alpha)
{
    assert(x);
    assert(y);

    *alpha = 0.0;
    for (int i = 0; i < n; i++) {
        *alpha += x[i * incx] * y[i * incy];
    }
}